

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O0

RealType __thiscall OpenMD::EAMAdapter::getEta(EAMAdapter *this)

{
  ZhouParameters zhouParam;
  undefined8 local_a0;
  EAMAdapter *in_stack_ffffffffffffffa8;
  
  getZhouParam(in_stack_ffffffffffffffa8);
  ZhouParameters::~ZhouParameters(local_a0);
  return (RealType)local_a0;
}

Assistant:

RealType EAMAdapter::getEta() {
    ZhouParameters zhouParam = getZhouParam();
    return zhouParam.eta;
  }